

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_databases.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBDatabasesInit(ClientContext *context,TableFunctionInitInput *input)

{
  DatabaseManager *this;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DuckDBDatabasesData_*,_false> local_30;
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  local_28;
  
  make_uniq<duckdb::DuckDBDatabasesData>();
  this = DatabaseManager::Get((ClientContext *)input);
  DatabaseManager::GetDatabases
            ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)&local_28,this,
             (ClientContext *)input);
  pDVar1 = unique_ptr<duckdb::DuckDBDatabasesData,_std::default_delete<duckdb::DuckDBDatabasesData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBDatabasesData,_std::default_delete<duckdb::DuckDBDatabasesData>,_true>
                         *)&local_30);
  ::std::
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::_M_move_assign(&(pDVar1->entries).
                    super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                   ,&local_28);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::~_Vector_base(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBDatabasesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBDatabasesData>();

	// scan all the schemas for tables and collect them and collect them
	auto &db_manager = DatabaseManager::Get(context);
	result->entries = db_manager.GetDatabases(context);
	return std::move(result);
}